

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O3

int dog_move(monst *mtmp,int after)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  obj *poVar10;
  void *pvVar11;
  monst *pmVar12;
  coord *pcVar13;
  permonst *ppVar14;
  trap *ptVar15;
  ulong uVar16;
  long lVar17;
  xchar xVar18;
  char cVar19;
  undefined1 *puVar20;
  char cVar21;
  int iVar22;
  char *pcVar23;
  char *pcVar24;
  int iVar25;
  char cVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  obj *obj;
  ulong uVar31;
  obj **obj_00;
  long lVar32;
  coord cc;
  coord poss [9];
  boolean cursemsg [9];
  long info [9];
  coord local_147;
  char local_145;
  int local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  int local_134;
  ulong local_130;
  ulong local_128;
  int local_11c;
  ulong local_118;
  long local_110;
  int local_104;
  undefined1 *local_100;
  long local_f8;
  long local_f0;
  int local_e4;
  obj *local_e0;
  undefined4 local_d8;
  char local_c1 [9];
  permonst *local_b8;
  long local_b0;
  ulong local_a8;
  uint local_9c;
  permonst *local_98;
  permonst *local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  
  uVar6 = *(uint *)&mtmp->field_0x60;
  local_110 = CONCAT44(local_110._4_4_,uVar6);
  cVar19 = mtmp->mx;
  cVar1 = mtmp->my;
  lVar30 = (long)cVar19;
  lVar32 = (long)cVar1;
  local_e4 = after;
  if (((uVar6 >> 0x1a & 1) == 0) &&
     (iVar22 = *(int *)((long)&mtmp[1].data + 4), iVar22 + 500U < moves)) {
    if ((mtmp->data->mflags1 & 0x60000000) == 0) {
      *(uint *)((long)&mtmp[1].data + 4) = moves + 500;
    }
    else if (*(int *)&mtmp[1].minvent == 0) {
      iVar22 = mtmp->mhpmax / 3;
      uVar6 = uVar6 | 0x200000;
      *(uint *)&mtmp->field_0x60 = uVar6;
      *(int *)&mtmp[1].minvent = mtmp->mhpmax - iVar22;
      mtmp->mhpmax = iVar22;
      iVar29 = mtmp->mhp;
      if (iVar22 < mtmp->mhp) {
        mtmp->mhp = iVar22;
        iVar29 = iVar22;
      }
      if (iVar29 < 1) goto LAB_001747f6;
      if ((viz_array[lVar32][lVar30] & 2U) == 0) {
        if ((viz_array[lVar32][lVar30] & 1U) == 0) {
          pcVar23 = y_monnam(mtmp);
          pcVar24 = "You feel worried about %s.";
          goto LAB_00174893;
        }
        beg(mtmp);
      }
      else {
        pcVar23 = Monnam(mtmp);
        pcVar24 = "%s is confused from hunger.";
LAB_00174893:
        pline(pcVar24,pcVar23);
      }
      stop_occupation();
    }
    else if ((iVar22 + 0x2eeU < moves) || (mtmp->mhp < 1)) {
LAB_001747f6:
      if (((uVar6 >> 0x18 & 1) == 0) || (u.usteed == mtmp)) {
        if ((viz_array[lVar32][lVar30] & 2U) == 0) {
          pcVar23 = "sad";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar23 = "bummed";
            }
            else {
              bVar5 = dmgtype(youmonst.data,0x24);
              pcVar23 = "sad";
              if (bVar5 == '\0') {
                pcVar23 = "bummed";
              }
            }
          }
          pcVar24 = "You feel %s for a moment.";
        }
        else {
          pcVar23 = Monnam(mtmp);
          pcVar24 = "%s starves.";
        }
        pline(pcVar24,pcVar23);
      }
      else {
        pline("Your leash goes slack.");
      }
      mondied(mtmp);
      return 2;
    }
  }
  local_134 = (int)cVar19;
  local_11c = (int)cVar1;
  uVar6 = dist2(local_134,local_11c,(int)u.ux,(int)u.uy);
  if (u.usteed == mtmp) {
    uVar31 = 1;
    if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
       (iVar22 = resist(mtmp,'\x04',0,0), iVar22 == 0)) {
      dismount_steed(2);
      return 1;
    }
  }
  else {
    uVar31 = (ulong)uVar6;
    if (uVar6 == 0) {
      return 0;
    }
  }
  local_c1[0] = '\0';
  local_78 = 0;
  local_118 = uVar31;
  local_88 = lVar32;
  local_80 = lVar30;
  cVar21 = cVar1;
  if (((uint)local_110 >> 0x1a & 1) == 0) {
    if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
LAB_00174a8e:
      puVar20 = &mtmp->field_0x74;
      uVar6 = moves - *(int *)&mtmp[1].data;
      local_a8 = (ulong)CONCAT31((int3)(uVar6 >> 8),uVar6 < 5);
      goto LAB_00174ab8;
    }
    iVar29 = (int)mtmp->mx;
    iVar22 = (int)mtmp->my;
    poVar10 = DROPPABLES(mtmp);
    if (poVar10 != (obj *)0x0) {
      iVar22 = (int)local_118;
      uVar6 = mt_random();
      if (((SUB168(ZEXT416(uVar6) % SEXT816((long)(iVar22 + 1)),0) == 0) ||
          (iVar22 = *(int *)((long)&mtmp[1].nmon + 4), uVar6 = mt_random(),
          SUB168(ZEXT416(uVar6) % SEXT816((long)iVar22),0) == 0)) &&
         (uVar6 = mt_random(), (int)(uVar6 % 10) < *(int *)((long)&mtmp[1].nmon + 4))) {
        relobj(mtmp,*(uint *)&mtmp->field_0x60 >> 1 & 1,'\x01');
        iVar22 = *(int *)((long)&mtmp[1].nmon + 4);
        if (1 < iVar22) {
          *(int *)((long)&mtmp[1].nmon + 4) = iVar22 + -1;
        }
        *(int *)&mtmp[1].nmon = (int)local_118;
        *(uint *)&mtmp->field_0x74 = moves;
      }
      goto LAB_00174a8e;
    }
    poVar10 = level->objects[iVar29][iVar22];
    if (((poVar10 == (obj *)0x0) ||
        (pvVar11 = memchr("\x0f\x10\x0e",(int)poVar10->oclass,4), pvVar11 != (void *)0x0)) ||
       (((poVar10->field_0x4b & 0x20) != 0 && (2 < (ushort)(poVar10->otyp - 0xdaU)))))
    goto LAB_00174a8e;
    iVar27 = dogfood(mtmp,poVar10);
    if (((1 < iVar27) && ((iVar27 != 2 || (*(int *)&mtmp[1].minvent == 0)))) ||
       (bVar5 = could_reach_item(mtmp,poVar10->ox,poVar10->oy), bVar5 == '\0')) {
      bVar5 = can_carry(mtmp,poVar10);
      if ((((bVar5 != '\0') && ((poVar10->field_0x4a & 1) == 0)) &&
          (bVar5 = could_reach_item(mtmp,poVar10->ox,poVar10->oy), bVar5 != '\0')) &&
         (uVar6 = mt_random(), (int)(uVar6 % 0x14) < *(int *)((long)&mtmp[1].nmon + 4) + 3)) {
        uVar6 = mt_random();
        if (SUB168(ZEXT416(uVar6) % SEXT816((long)(int)local_118),0) == 0) {
          local_128 = (ulong)*(int *)((long)&mtmp[1].nmon + 4);
          uVar6 = mt_random();
          if (SUB168(ZEXT416(uVar6) % SEXT816((long)local_128),0) != 0) goto LAB_00174a8e;
        }
        if (((viz_array[iVar22][iVar29] & 2U) != 0) && (flags.verbose != '\0')) {
          pcVar23 = Monnam(mtmp);
          pcVar24 = distant_name(poVar10,doname);
          pline("%s picks up %s.",pcVar23,pcVar24);
        }
        obj_extract_self(poVar10);
        newsym(iVar29,iVar22);
        mpickobj(mtmp,poVar10);
        bVar5 = attacktype(mtmp->data,0xfe);
        if ((bVar5 != '\0') && (mtmp->weapon_check == '\x01')) {
          mtmp->weapon_check = '\x03';
          mon_wield_item(mtmp);
        }
        m_dowear(level,mtmp,'\0');
      }
      goto LAB_00174a8e;
    }
    pmVar12 = (monst *)0x0;
    iVar22 = dog_eat(mtmp,poVar10,iVar29,iVar22,'\0');
    if (iVar22 == 2) {
      return 2;
    }
    local_138 = -1;
    uVar9 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar22 >> 8),1);
    local_144 = local_134;
    cVar26 = cVar19;
  }
  else {
    puVar20 = (undefined1 *)0x0;
    local_a8 = 0;
LAB_00174ab8:
    if (u.usteed == mtmp) {
      return 0;
    }
    cVar26 = mtmp->mx;
    lVar32 = (long)cVar26;
    cVar2 = mtmp->my;
    lVar30 = (long)cVar2;
    local_138 = CONCAT31(local_138._1_3_,viz_array[lVar30][lVar32]);
    poVar10 = DROPPABLES(mtmp);
    local_100 = puVar20;
    local_f8 = lVar32;
    if ((puVar20 == (undefined1 *)0x0) || ((mtmp->field_0x63 & 1) != 0)) {
      gtyp = '\x04';
      gx = u.ux;
      gy = u.uy;
      iVar22 = 1;
    }
    else {
      gtyp = '\x06';
      gy = '\0';
      gx = '\0';
      iVar22 = 6;
      if (6 < cVar26) {
        iVar22 = (int)cVar26;
      }
      iVar29 = 0x4a;
      if (cVar26 < 0x4a) {
        iVar29 = (int)cVar26;
      }
      iVar27 = 5;
      if (5 < cVar2) {
        iVar27 = (int)cVar2;
      }
      iVar25 = 0xf;
      if (cVar2 < 0xf) {
        iVar25 = (int)cVar2;
      }
      obj = level->objlist;
      local_e0 = poVar10;
      if (obj != (obj *)0x0) {
        iVar22 = iVar22 + -5;
        iVar29 = iVar29 + 5;
        local_140 = iVar27 - 5;
        local_104 = iVar25 + 5;
        local_b0 = lVar32 * 0xfc;
        local_b8 = (permonst *)(lVar30 * 3);
        local_130 = CONCAT44(local_130._4_4_,iVar22);
        local_145 = cVar19;
        local_144 = iVar29;
        local_f0 = lVar30;
        uVar6 = local_140;
        do {
          cVar19 = obj->ox;
          local_128 = CONCAT71(local_128._1_7_,cVar19);
          iVar27 = (int)cVar19;
          if ((iVar22 <= iVar27) && (iVar27 <= iVar29)) {
            cVar26 = obj->oy;
            local_13c = CONCAT31(local_13c._1_3_,cVar26);
            iVar25 = (int)cVar26;
            if (((int)uVar6 <= iVar25) && (iVar25 <= local_104)) {
              iVar7 = dogfood(mtmp,obj);
              iVar22 = (int)local_130;
              iVar29 = local_144;
              uVar6 = local_140;
              if ((iVar7 << 0x18 != 0x6000000) && (xVar18 = (xchar)iVar7, xVar18 <= gtyp)) {
                for (pmVar12 = (monst *)level->objects[(char)local_128][(char)local_13c];
                    pmVar12 != (monst *)0x0; pmVar12 = ((vptrs *)&pmVar12->data)->v_ocarry) {
                  if ((pmVar12->mtrack[3].x & 1U) != 0) {
                    if (('\x02' < xVar18) || (*(int *)(local_100 + 0x1c) == 0)) goto LAB_00174e5f;
                    break;
                  }
                }
                bVar5 = could_reach_item(mtmp,cVar19,cVar26);
                iVar22 = (int)local_130;
                iVar29 = local_144;
                uVar6 = local_140;
                if (bVar5 != '\0') {
                  bVar5 = can_reach_location(mtmp,mtmp->mx,mtmp->my,cVar19,cVar26);
                  iVar22 = (int)local_130;
                  iVar29 = local_144;
                  uVar6 = local_140;
                  if (bVar5 != '\0') {
                    if (xVar18 < '\x03') {
                      if (gtyp <= xVar18) {
                        iVar22 = (int)local_f8;
                        iVar29 = (int)local_f0;
                        iVar27 = dist2(iVar27,iVar25,iVar22,iVar29);
                        iVar25 = dist2((int)gx,(int)gy,iVar22,iVar29);
                        iVar22 = (int)local_130;
                        iVar29 = local_144;
                        uVar6 = local_140;
                        if (iVar25 <= iVar27) goto LAB_00174e5f;
                      }
LAB_00174e45:
                      gx = (char)local_128;
                      gy = (char)local_13c;
                      iVar22 = (int)local_130;
                      iVar29 = local_144;
                      gtyp = xVar18;
                      uVar6 = local_140;
                    }
                    else if (((local_e0 == (obj *)0x0 && (local_138 & 1) != 0) && gtyp == '\x06') &&
                            ((((&level->locations[0][0].field_0x7)[(long)local_b8 * 4 + local_b0] &
                              4) == 0 || ((level->locations[u.ux][u.uy].field_0x7 & 4) != 0)))) {
                      if (iVar7 << 0x18 != 0x3000000) {
                        bVar5 = clear_path((int)mtmp->mx,(int)mtmp->my,iVar27,iVar25);
                        iVar22 = (int)local_130;
                        iVar29 = local_144;
                        uVar6 = local_140;
                        if (bVar5 == '\0') goto LAB_00174e5f;
                      }
                      iVar27 = *(int *)(local_100 + 8);
                      uVar8 = mt_random();
                      iVar22 = (int)local_130;
                      iVar29 = local_144;
                      uVar6 = local_140;
                      if ((int)(uVar8 & 7) < iVar27) {
                        bVar5 = can_carry(mtmp,obj);
                        xVar18 = '\x04';
                        iVar22 = (int)local_130;
                        iVar29 = local_144;
                        uVar6 = local_140;
                        if (bVar5 != '\0') goto LAB_00174e45;
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00174e5f:
          obj = obj->nobj;
        } while (obj != (obj *)0x0);
        lVar30 = local_f0;
        cVar19 = local_145;
        if ((gtyp != '\x06') &&
           ((iVar22 = 1, (gtyp & 0xfbU) == 0 || (*(uint *)(local_100 + 0x10) <= moves))))
        goto LAB_00174f57;
      }
      gx = u.ux;
      gy = u.uy;
      if ((local_e4 != 0) && ((int)local_118 < 5)) {
        gx = u.ux;
        gy = u.uy;
        return 0;
      }
      iVar22 = 1;
      iVar29 = 1;
      if (((int)local_118 < 9) &&
         (iVar29 = (*(int *)&mtmp->field_0x60 << 0xf) >> 0x1f, (int)local_118 < 2)) {
LAB_00176040:
        iVar22 = iVar29;
        if (iVar29 == 0) {
          obj_00 = &invent;
          iVar22 = 1;
          do {
            obj_00 = &((obj *)obj_00)->nobj->nobj;
            if ((obj *)obj_00 == (obj *)0x0) {
              iVar22 = 0;
              break;
            }
            iVar29 = dogfood(mtmp,(obj *)obj_00);
          } while (iVar29 != 0);
        }
      }
      else if ('\x18' < level->locations[u.ux][u.uy].typ) {
        uVar6 = mt_random();
        if (((uVar6 & 3) != 0 && (char)local_a8 == '\0') &&
           ((local_e0 == (obj *)0x0 ||
            (iVar27 = *(int *)(local_100 + 8), uVar6 = mt_random(),
            SUB168(ZEXT416(uVar6) % SEXT816((long)iVar27),0) == 0)))) goto LAB_00176040;
      }
    }
LAB_00174f57:
    lVar32 = local_f8;
    iVar29 = 0;
    if ((mtmp->field_0x62 & 0x20) == 0) {
      iVar29 = iVar22;
    }
    local_e0 = (obj *)CONCAT44(local_e0._4_4_,iVar29);
    if (((gx == u.ux) && (gy == u.uy)) &&
       (uVar6 = local_138 & 1, local_138 = local_138 & 0xffffff01, uVar6 == 0)) {
      iVar29 = (int)local_f8;
      pcVar13 = gettrack(iVar29,(int)lVar30);
      puVar20 = local_100;
      iVar22 = (int)local_118;
      if (pcVar13 == (coord *)0x0) {
        if (((local_100 == (undefined1 *)0x0) || (gx = local_100[0x20], gx == '\0')) ||
           (gy = local_100[0x21], (char)lVar30 == gy && (char)lVar32 == gx)) {
          local_d8 = 0x1a44;
          gy = 'R';
          gx = 'R';
          do_clear_area(iVar29,(int)lVar30,9,wantdoor,&local_d8);
          xVar18 = gy;
          if ((gx == 'R') || (gy == (char)lVar30 && gx == (char)lVar32)) {
            gx = u.ux;
            gy = u.uy;
          }
          else if (puVar20 != (undefined1 *)0x0) {
            puVar20[0x20] = gx;
            puVar20[0x21] = xVar18;
          }
        }
        else {
          local_100[0x20] = 0;
        }
      }
      else {
        gx = pcVar13->x;
        gy = pcVar13->y;
        if (local_100 != (undefined1 *)0x0) {
          local_100[0x20] = 0;
        }
      }
    }
    else {
      iVar22 = (int)local_118;
      if (local_100 != (undefined1 *)0x0) {
        local_100[0x20] = 0;
      }
    }
    uVar31 = 0x660a0000;
    if ((mtmp->data->mflags1 & 8) == 0) {
      uVar31 = 0x600a0000;
    }
    bVar5 = passes_bars(mtmp->data);
    if ((bVar5 != '\0') || ((int)mtmp->data->mflags1 < 0)) {
      uVar31 = uVar31 | 0x10000000;
    }
    uVar31 = mtmp->data->mflags2 >> 2 & 0x2000000 | uVar31;
    if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
       (iVar29 = resist(mtmp,'\x04',0,0), iVar29 == 0)) {
      if (((uint)local_110 >> 0x1a & 1) != 0) {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001760d8;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00175dc7;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00175dbe;
          }
          else {
LAB_00175dbe:
            if (ublindf == (obj *)0x0) goto LAB_00176127;
LAB_00175dc7:
            if (ublindf->oartifact != '\x1d') goto LAB_00176127;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_001760d8;
LAB_00176127:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar10 = which_armor(mtmp,4), poVar10 == (obj *)0x0 ||
              (poVar10 = which_armor(mtmp,4), poVar10->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00176182;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017617d;
            }
            else {
LAB_0017617d:
              if (ublindf != (obj *)0x0) {
LAB_00176182:
                if (ublindf->oartifact == '\x1d') goto LAB_00176215;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_00176271;
            }
LAB_00176215:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar22 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar22 < 0x41))))
            goto LAB_00176271;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(mtmp), bVar5 == '\0'))))
          goto LAB_0017629d;
        }
        else {
          bVar5 = worm_known(level,mtmp);
          if (bVar5 == '\0') goto LAB_00176127;
LAB_001760d8:
          uVar6 = *(uint *)&mtmp->field_0x60;
          if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00176119;
            goto LAB_00176127;
          }
          if ((uVar6 & 0x280) != 0) goto LAB_00176127;
LAB_00176119:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00176127;
        }
LAB_00176271:
        pcVar23 = Monnam(mtmp);
        pline("%s rebukes you, saying:",pcVar23);
        verbalize("Since you desire conflict, have some more!");
LAB_0017629d:
        mongone(mtmp);
        uVar6 = mt_random();
        iVar22 = (uVar6 & 3) + 1;
        do {
          local_d8._0_2_ = (coord)CONCAT11(u.uy,u.ux);
          bVar5 = enexto((coord *)&local_d8,level,u.ux,u.uy,mons + 0x7f);
          if (bVar5 != '\0') {
            mk_roamer(mons + 0x7f,u.ualign.type,level,(xchar)local_d8,local_d8._1_1_,'\0');
          }
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        return 2;
      }
      uVar31 = uVar31 | 0x40000;
    }
    if ((((u.uprops[0x15].extrinsic == 0 && u.uprops[0x15].intrinsic == 0) &&
         ((mtmp->field_0x62 & 0x20) == 0)) && (u.ustuck == mtmp)) &&
       (bVar5 = sticks(youmonst.data), bVar5 == '\0')) {
      unstuck(mtmp);
      pline("You get released!");
    }
    ppVar14 = mtmp->data;
    uVar6 = ppVar14->mflags1;
    if (((uVar6 >> 0xd & 1) == 0) && (ppVar14->msize != '\0')) {
      poVar10 = m_carrying(mtmp,0xe2);
      uVar31 = (ulong)(poVar10 != (obj *)0x0) << 0x18 | uVar31 | 0x400000;
      ppVar14 = mtmp->data;
      uVar6 = ppVar14->mflags1;
    }
    iVar27 = mfndpos(mtmp,(coord *)&local_d8,&local_78,
                     ((uVar6 & 0x20) << 0x16 | (ppVar14->mflags2 & 0x4000) << 10) | uVar31);
    iVar29 = local_134;
    cVar26 = (char)iVar27;
    local_128 = (ulong)(uint)(int)cVar26;
    if (cVar26 < '\x01') {
      local_13c = 0;
    }
    else {
      uVar31 = 0;
      local_13c = 0;
      do {
        cVar2 = *(char *)((long)&local_d8 + uVar31 * 2);
        cVar3 = *(char *)((long)&local_d8 + uVar31 * 2 + 1);
        pmVar12 = level->monsters[cVar2][cVar3];
        if (((pmVar12 == (monst *)0x0) || ((pmVar12->field_0x61 & 2) != 0)) ||
           ((*(byte *)((long)&local_78 + uVar31 * 8 + 2) & 8) != 0)) {
          for (pmVar12 = (monst *)level->objects[cVar2][cVar3]; pmVar12 != (monst *)0x0;
              pmVar12 = ((vptrs *)&pmVar12->data)->v_ocarry) {
            if ((pmVar12->mtrack[3].x & 1U) != 0) goto LAB_001751b9;
          }
          local_13c = (uint)(byte)((char)local_13c + 1);
        }
LAB_001751b9:
        uVar31 = uVar31 + 1;
      } while (uVar31 != local_128);
    }
    local_104 = dist2(local_134,local_11c,(int)gx,(int)gy);
    iVar27 = 0x11;
    if (0x11 < iVar22) {
      iVar27 = iVar22;
    }
    local_118 = CONCAT44(local_118._4_4_,iVar27);
    uVar9 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_104 >> 8),1);
    if (cVar26 < '\x01') {
      local_138 = -1;
      local_144 = iVar29;
      pmVar12 = (monst *)0x0;
      cVar26 = cVar19;
    }
    else {
      local_9c = (char)local_13c * 0xd;
      uVar6 = (int)cVar26;
      if (((uint)local_110 >> 0x1a & 1) == 0) {
        uVar6 = (int)(char)local_13c;
      }
      local_100 = (undefined1 *)(ulong)uVar6;
      uVar8 = 3;
      if (uVar6 - 2 < 3) {
        uVar8 = uVar6 - 2;
      }
      local_130 = (ulong)(uVar8 + 1);
      local_b0 = (long)local_100 * 4;
      local_138 = -1;
      local_b8 = mons + 0x1e;
      local_90 = mons + 10;
      local_98 = mons + 0xdb;
      uVar31 = 0;
      local_140 = 0;
      local_f8 = CONCAT71(local_f8._1_7_,cVar1);
      local_f0 = CONCAT71(local_f0._1_7_,cVar19);
      local_145 = cVar19;
      do {
        cVar19 = *(char *)((long)&local_d8 + uVar31 * 2);
        cVar21 = *(char *)((long)&local_d8 + uVar31 * 2 + 1);
        iVar29 = (int)cVar19;
        iVar22 = (int)cVar21;
        local_c1[uVar31] = '\0';
        if (((mtmp->field_0x63 & 1) == 0) ||
           (iVar27 = dist2(iVar29,iVar22,(int)u.ux,(int)u.uy), iVar27 < 5)) {
          if (((uint)local_110 >> 0x1a & 1) != 0) {
            iVar27 = dist2(iVar29,iVar22,(int)u.ux,(int)u.uy);
            if ((int)local_118 <= iVar27) goto LAB_00175724;
          }
          local_144 = iVar29;
          if (((((uint)(&local_78)[uVar31] >> 0x13 & 1) == 0) ||
              (pmVar12 = level->monsters[cVar19][cVar21], pmVar12 == (monst *)0x0)) ||
             ((pmVar12->field_0x61 & 2) != 0)) {
            if ((((uint)(&local_78)[uVar31] >> 0x11 & 1) != 0) &&
               (ptVar15 = t_at(level,iVar29,iVar22), ptVar15 != (trap *)0x0)) {
              if ((mtmp->field_0x63 & 1) == 0) {
                if (((ptVar15->field_0x8 & 0x20) != 0) &&
                   (uVar6 = mt_random(),
                   0x6666666 < (uVar6 * -0x33333333 >> 3 | uVar6 * -0x60000000))) goto LAB_00175724;
              }
              else if (flags.soundok != '\0') {
                whimper(mtmp);
              }
            }
            if ((((uint)local_110 >> 0x1a & 1) == 0) &&
               (pmVar12 = (monst *)level->objects[cVar19][cVar21], pmVar12 != (monst *)0x0)) {
              bVar4 = true;
              do {
                while ((*(byte *)((long)pmVar12->mtrack + 6) & 1) != 0) {
                  local_c1[uVar31] = '\x01';
                  pmVar12 = ((vptrs *)&pmVar12->data)->v_ocarry;
                  bVar4 = false;
                  if (pmVar12 == (monst *)0x0) goto LAB_001755ad;
                }
                iVar29 = dogfood(mtmp,(obj *)pmVar12);
                if ((iVar29 * 0x1000000 < 0x2000001) &&
                   ((iVar29 * 0x1000000 != 0x2000000 ||
                    (*(uint *)((long)&mtmp[1].data + 4) <= moves)))) {
                  local_c1[uVar31] = '\0';
                  uVar9 = 0;
                  local_138 = (int)uVar31;
                  cVar26 = local_145;
                  goto LAB_001757b6;
                }
                pmVar12 = (monst *)((vptrs *)&pmVar12->data)->v_nexthere;
              } while (pmVar12 != (monst *)0x0);
              if (!bVar4) {
LAB_001755ad:
                if (((mtmp->field_0x63 & 1) == 0 && '\0' < (char)local_13c) &&
                   (uVar6 = mt_random(), uVar6 % local_9c != 0)) goto LAB_00175724;
              }
            }
            if (1 < (int)local_100) {
              uVar28 = 0;
              uVar16 = local_130;
              lVar30 = local_b0;
              do {
                if (((cVar19 == mtmp->mtrack[uVar28].x) && (cVar21 == mtmp->mtrack[uVar28].y)) &&
                   (uVar6 = mt_random(), uVar16 = local_130,
                   SUB168(ZEXT416(uVar6) % SEXT816(lVar30),0) != 0)) goto LAB_00175724;
                uVar28 = uVar28 + 1;
                lVar30 = lVar30 + -4;
              } while (uVar16 != uVar28);
            }
            iVar22 = dist2(local_144,iVar22,(int)gx,(int)gy);
            iVar29 = (iVar22 - local_104) * (int)local_e0;
            if (iVar29 == 0) {
              cVar26 = (char)local_140 + '\x01';
              uVar6 = CONCAT31((int3)(local_140 >> 8),cVar26);
              uVar8 = mt_random();
              local_140 = uVar6;
              if (SUB168(ZEXT416(uVar8) % SEXT816((long)cVar26),0) != 0) goto LAB_00175724;
            }
            else if (-1 < iVar29) {
              if ((char)local_a8 == '\0') {
                if (((cVar1 == (char)local_f8 && local_145 == (char)local_f0) &&
                    (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) ||
                   (uVar6 = mt_random(),
                   (uVar6 * -0x55555555 >> 2 | uVar6 * -0x40000000) < 0x15555556))
                goto LAB_001756fb;
              }
              goto LAB_00175724;
            }
LAB_001756fb:
            local_140 = local_140 & 0xff;
            if (iVar29 < 0) {
              local_140 = 0;
            }
            local_f0 = CONCAT71(local_f0._1_7_,cVar19);
            local_f8 = CONCAT71(local_f8._1_7_,cVar21);
            local_138 = (int)uVar31;
            local_104 = iVar22;
          }
          else if ((uint)pmVar12->m_lev < mtmp->m_lev + 2) {
            ppVar14 = pmVar12->data;
            if (ppVar14 == local_b8) {
              uVar6 = mt_random();
              if (((0x19999999 <
                    (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f)) &&
                  ((mtmp->field_0x62 & 2) != 0)) &&
                 (((uVar6 = mtmp->data->mflags1, (uVar6 >> 0xc & 1) == 0 &&
                   ((*(uint *)&pmVar12->field_0x60 >> 0x11 & 1) != 0)) &&
                  (((uVar6 >> 0x18 & 1) != 0 || ((*(uint *)&pmVar12->field_0x60 & 2) == 0))))))
              goto LAB_00175724;
              ppVar14 = pmVar12->data;
            }
            if ((ppVar14 != local_90) ||
               (uVar6 = mt_random(),
               (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) <
               0x1999999a)) {
              iVar22 = max_passive_dmg(pmVar12,mtmp);
              if (iVar22 < mtmp->mhp) {
                if (mtmp->mhp * 4 < mtmp->mhpmax) {
LAB_00175438:
                  if (((pmVar12->field_0x62 & 0x40) != 0) &&
                     ((u.uprops[0x15].intrinsic == 0 && (u.uprops[0x15].extrinsic == 0))))
                  goto LAB_00175724;
                  ppVar14 = pmVar12->data;
                }
                else {
                  ppVar14 = pmVar12->data;
                  if ((ppVar14->msound == '!') || (ppVar14->msound == '\x1f')) goto LAB_00175438;
                }
                if (((ppVar14 != local_98) || ((mtmp->mintrinsics & 8) != 0)) &&
                   ((ppVar14 != mons + 0xb && ppVar14 != mons + 0xc ||
                    ((mtmp->mintrinsics & 0x80) != 0)))) {
                  if (local_e4 != 0) {
                    return 0;
                  }
                  notonhead = '\0';
                  uVar6 = mattackm(mtmp,pmVar12);
                  if ((uVar6 & 4) != 0) {
                    return 2;
                  }
                  if ((uVar6 & 3) != 1) {
                    return 0;
                  }
                  uVar6 = mt_random();
                  if ((uVar6 & 3) == 0) {
                    return 0;
                  }
                  if (pmVar12->mlstmv == moves) {
                    return 0;
                  }
                  bVar5 = onscary((int)mtmp->mx,(int)mtmp->my,pmVar12);
                  if (bVar5 != '\0') {
                    return 0;
                  }
                  bVar5 = monnear(pmVar12,(int)mtmp->mx,(int)mtmp->my);
                  if (bVar5 == '\0') {
                    return 0;
                  }
                  uVar6 = mattackm(pmVar12,mtmp);
                  if ((uVar6 & 2) == 0) {
                    return 0;
                  }
                  return 2;
                }
              }
            }
          }
        }
LAB_00175724:
        uVar31 = uVar31 + 1;
      } while (uVar31 != local_128);
      local_144 = (int)(char)local_f0;
      pmVar12 = (monst *)0x0;
      uVar9 = (undefined4)CONCAT71((uint7)(uint3)((char)local_f0 >> 7),1);
      cVar19 = (char)local_f0;
      cVar26 = local_145;
      cVar21 = (char)local_f8;
    }
  }
LAB_001757b6:
  iVar29 = local_11c;
  iVar22 = local_134;
  if ((cVar19 == cVar26) && (cVar21 == cVar1)) {
    if ((mtmp->field_0x63 & 1) == 0) {
      return 1;
    }
    iVar27 = dist2(local_134,local_11c,(int)u.ux,(int)u.uy);
    if (4 < iVar27) {
      iVar22 = sgn(iVar22 - u.ux);
      iVar29 = sgn(iVar29 - u.uy);
      local_147.x = u.ux + (char)iVar22;
      local_147.y = u.uy + (char)iVar29;
      bVar5 = goodpos(level,(int)local_147.x,(int)local_147.y,mtmp,0);
      if (bVar5 == '\0') {
        iVar22 = xytod((char)iVar22,(char)iVar29);
        uVar6 = iVar22 + 0xe;
        if (-1 < (int)(iVar22 + 7U)) {
          uVar6 = iVar22 + 7U;
        }
        iVar29 = (iVar22 - (uVar6 & 0xfffffff8)) + 7;
        uVar6 = iVar22 + 8;
        if (-1 < (int)(iVar22 + 1U)) {
          uVar6 = iVar22 + 1U;
        }
        iVar27 = (iVar22 - (uVar6 & 0xfffffff8)) + 1;
        if (iVar29 < iVar27) {
          do {
            dtoxy(&local_147,iVar29);
            bVar5 = goodpos(level,(int)local_147.x,(int)local_147.y,mtmp,0);
            if (bVar5 != '\0') goto LAB_0017595c;
            iVar29 = iVar29 + 1;
          } while (iVar27 != iVar29);
        }
        uVar6 = iVar22 + 0xd;
        if (-1 < (int)(iVar22 + 6U)) {
          uVar6 = iVar22 + 6U;
        }
        iVar29 = (iVar22 - (uVar6 & 0xfffffff8)) + 6;
        uVar6 = iVar22 + 9;
        if (-1 < (int)(iVar22 + 2U)) {
          uVar6 = iVar22 + 2U;
        }
        iVar22 = (iVar22 - (uVar6 & 0xfffffff8)) + 2;
        if (iVar29 < iVar22) {
          do {
            dtoxy(&local_147,iVar29);
            bVar5 = goodpos(level,(int)local_147.x,(int)local_147.y,mtmp,0);
            if (bVar5 != '\0') goto LAB_0017595c;
            iVar29 = iVar29 + 1;
          } while (iVar22 != iVar29);
        }
        local_147.x = mtmp->mx;
        local_147.y = mtmp->my;
      }
LAB_0017595c:
      bVar5 = m_in_out_region(mtmp,cVar26,(xchar)local_11c);
      if (bVar5 != '\0') {
        remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
        place_monster(mtmp,(int)local_147.x,(int)local_147.y);
        newsym((int)local_147.x,(int)local_147.y);
        set_apparxy(level,mtmp);
      }
    }
    return 1;
  }
  lVar30 = (long)(int)local_138;
  if ((*(byte *)((long)&local_78 + lVar30 * 8 + 2) & 4) != 0) {
    if ((mtmp->field_0x63 & 1) != 0) {
      pcVar23 = Monnam(mtmp);
      iVar22 = pronoun_gender(level,mtmp);
      pline("%s breaks loose of %s leash!",pcVar23,genders[iVar22].his);
      m_unleash(mtmp,'\0');
    }
    mattacku(mtmp);
    return 0;
  }
  local_128 = CONCAT44(local_128._4_4_,(int)cVar21);
  local_13c = uVar9;
  bVar5 = m_in_out_region(mtmp,cVar19,cVar21);
  if (bVar5 == '\0') {
    return 1;
  }
  lVar32 = (long)cVar19;
  lVar17 = (long)cVar21;
  local_130 = lVar17;
  local_110 = lVar32;
  if (('\x10' < level->locations[lVar32][lVar17].typ) ||
     (bVar5 = may_dig(level,cVar19,(xchar)local_128), bVar5 == '\0')) {
    bVar5 = closed_door(level,local_144,(int)local_128);
    if (bVar5 == '\0') goto LAB_00175c06;
  }
  if ((mtmp->weapon_check == '\0') || ((~mtmp->data->mflags1 & 0x60) != 0)) goto LAB_00175c06;
  bVar5 = closed_door(level,local_144,(int)local_128);
  xVar18 = '\x06';
  if (bVar5 == '\0') {
    cVar19 = level->locations[lVar32][lVar17].typ;
    if ((cVar19 != '\r') &&
       ((cVar19 != '\0' || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)))) {
      poVar10 = mtmp->mw;
      xVar18 = '\x04';
      if ((poVar10 != (obj *)0x0) &&
         (((byte)(poVar10->oclass | 4U) == 6 && (objects[poVar10->otyp].oc_subtyp == '\x04'))))
      goto LAB_0017637a;
      goto LAB_00175bed;
    }
    poVar10 = mtmp->mw;
    xVar18 = '\x05';
    if ((poVar10 == (obj *)0x0) ||
       (((byte)(poVar10->oclass | 4U) != 6 || (objects[poVar10->otyp].oc_subtyp != '\x03'))))
    goto LAB_00175bed;
LAB_0017637a:
    if (mtmp->weapon_check < '\x04') goto LAB_00175c06;
  }
  else {
LAB_00175bed:
    mtmp->weapon_check = xVar18;
  }
  iVar22 = mon_wield_item(mtmp);
  if (iVar22 != 0) {
    return 0;
  }
LAB_00175c06:
  remove_monster(level,local_134,local_11c);
  place_monster(mtmp,local_144,(int)local_128);
  if ((local_c1[lVar30] != '\0') &&
     (((viz_array[local_88][local_80] & 2U) != 0 || ((viz_array[local_130][local_110] & 2U) != 0))))
  {
    pcVar23 = Monnam(mtmp);
    pline("%s moves only reluctantly.",pcVar23);
  }
  mtmp->mtrack[3] = mtmp->mtrack[2];
  *(undefined4 *)(mtmp->mtrack + 1) = *(undefined4 *)mtmp->mtrack;
  mtmp->mtrack[0].x = cVar26;
  mtmp->mtrack[0].y = cVar1;
  if ((char)local_13c == '\0') {
    iVar22 = dog_eat(mtmp,(obj *)pmVar12,local_134,local_11c,'\0');
    return (iVar22 == 2) + 1;
  }
  return 1;
}

Assistant:

int dog_move(struct monst *mtmp, 
	     int after)	/* this is extra fast monster movement */
{
	int omx, omy;		/* original mtmp position */
	int appr, whappr, udist;
	int i, j, k;
	struct edog *edog = EDOG(mtmp);
	struct obj *obj = NULL;
	xchar otyp;
	boolean has_edog, cursemsg[9], do_eat = FALSE;
	xchar nix, niy;		/* position mtmp is (considering) moving to */
	int nx, ny;	/* temporary coordinates */
	xchar cnt, uncursedcnt, chcnt;
	int chi = -1, nidist, ndist;
	coord poss[9];
	long info[9], allowflags;
#define GDIST(x,y) (dist2(x,y,gx,gy))

	/*
	 * Tame Angels have isminion set and an ispriest structure instead of
	 * an edog structure.  Fortunately, guardian Angels need not worry
	 * about mundane things like eating and fetching objects, and can
	 * spend all their energy defending the player.  (They are the only
	 * monsters with other structures that can be tame.)
	 */
	has_edog = !mtmp->isminion;

	omx = mtmp->mx;
	omy = mtmp->my;
	if (has_edog && dog_hunger(mtmp, edog)) return 2;	/* starved */

	udist = distu(omx,omy);
	/* Let steeds eat and maybe throw rider during Conflict */
	if (mtmp == u.usteed) {
	    if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
		dismount_steed(DISMOUNT_THROWN);
		return 1;
	    }
	    udist = 1;
	} else if (!udist)
	/* maybe we tamed him while being swallowed --jgm */
		return 0;

	nix = omx;	/* set before newdogpos */
	niy = omy;
	cursemsg[0] = FALSE;	/* lint suppression */
	info[0] = 0;		/* ditto */

	if (has_edog) {
	    j = dog_invent(mtmp, edog, udist);
	    if (j == 2) return 2;		/* died */
	    else if (j == 1) goto newdogpos;	/* eating something */

	    whappr = (moves - edog->whistletime < 5);
	} else
	    whappr = 0;

	appr = dog_goal(mtmp, has_edog ? edog : NULL,
							after, udist, whappr);
	if (appr == -2) return 0;

	allowflags = ALLOW_M | ALLOW_TRAPS | ALLOW_SSM | ALLOW_SANCT;
	if (passes_walls(mtmp->data)) allowflags |= (ALLOW_ROCK | ALLOW_WALL);
	if (passes_bars(mtmp->data) || metallivorous(mtmp->data))
	    allowflags |= ALLOW_BARS;
	if (throws_rocks(mtmp->data)) allowflags |= ALLOW_ROCK;
	if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
	    allowflags |= ALLOW_U;
	    if (!has_edog) {
		coord mm;
		/* Guardian angel refuses to be conflicted; rather,
		 * it disappears, angrily, and sends in some nasties
		 */
		if (canspotmon(level, mtmp)) {
		    pline("%s rebukes you, saying:", Monnam(mtmp));
		    verbalize("Since you desire conflict, have some more!");
		}
		mongone(mtmp);
		i = rnd(4);
		while (i--) {
		    mm.x = u.ux;
		    mm.y = u.uy;
		    if (enexto(&mm, level, mm.x, mm.y, &mons[PM_ANGEL]))
			mk_roamer(&mons[PM_ANGEL], u.ualign.type,
					 level, mm.x, mm.y, FALSE);
		}
		return 2;

	    }
	}
	if (!Conflict && !mtmp->mconf &&
	    mtmp == u.ustuck && !sticks(youmonst.data)) {
	    unstuck(mtmp);	/* swallowed case handled above */
	    pline("You get released!");
	}
	if (!nohands(mtmp->data) && !verysmall(mtmp->data)) {
		allowflags |= OPENDOOR;
		if (m_carrying(mtmp, SKELETON_KEY)) allowflags |= BUSTDOOR;
	}
	if (is_giant(mtmp->data)) allowflags |= BUSTDOOR;
	if (tunnels(mtmp->data)) allowflags |= ALLOW_DIG;
	cnt = mfndpos(mtmp, poss, info, allowflags);

	/* Normally dogs don't step on cursed items, but if they have no
	 * other choice they will.  This requires checking ahead of time
	 * to see how many uncursed item squares are around.
	 */
	uncursedcnt = 0;
	for (i = 0; i < cnt; i++) {
		nx = poss[i].x; ny = poss[i].y;
		if (MON_AT(level, nx,ny) && !(info[i] & ALLOW_M)) continue;
		if (cursed_object_at(nx, ny)) continue;
		uncursedcnt++;
	}

	chcnt = 0;
	chi = -1;
	nidist = GDIST(nix,niy);

	for (i = 0; i < cnt; i++) {
		nx = poss[i].x;
		ny = poss[i].y;
		cursemsg[i] = FALSE;

		/* if leashed, we drag him along. */
		if (mtmp->mleashed && distu(nx, ny) > 4) continue;

		/* if a guardian, try to stay close by choice */
		if (!has_edog &&
		    (j = distu(nx, ny)) > 16 && j >= udist) continue;

		if ((info[i] & ALLOW_M) && MON_AT(level, nx, ny)) {
		    int mstatus;
		    struct monst *mtmp2 = m_at(level, nx,ny);

		    if ((int)mtmp2->m_lev >= (int)mtmp->m_lev+2 ||
			(mtmp2->data == &mons[PM_FLOATING_EYE] && rn2(10) &&
			 mtmp->mcansee && haseyes(mtmp->data) && mtmp2->mcansee
			 && (perceives(mtmp->data) || !mtmp2->minvis)) ||
			(mtmp2->data==&mons[PM_GELATINOUS_CUBE] && rn2(10)) ||
			(max_passive_dmg(mtmp2, mtmp) >= mtmp->mhp) ||
			((mtmp->mhp*4 < mtmp->mhpmax
			  || mtmp2->data->msound == MS_GUARDIAN
			  || mtmp2->data->msound == MS_LEADER) &&
			 mtmp2->mpeaceful && !Conflict) ||
			(touch_disintegrates(mtmp2->data) &&
			 !resists_disint(mtmp)) ||
			(touch_petrifies(mtmp2->data) &&
			 !resists_ston(mtmp)))
			continue;

		    if (after) return 0; /* hit only once each move */

		    notonhead = 0;
		    mstatus = mattackm(mtmp, mtmp2);

		    /* aggressor (pet) died */
		    if (mstatus & MM_AGR_DIED) return 2;

		    if ((mstatus & MM_HIT) && !(mstatus & MM_DEF_DIED) &&
			    rn2(4) && mtmp2->mlstmv != moves &&
			    !onscary(mtmp->mx, mtmp->my, mtmp2) &&
			    /* monnear check needed: long worms hit on tail */
			    monnear(mtmp2, mtmp->mx, mtmp->my)) {
			mstatus = mattackm(mtmp2, mtmp);  /* return attack */
			if (mstatus & MM_DEF_DIED) return 2;
		    }

		    return 0;
		}

		{   /* Dog avoids harmful traps, but perhaps it has to pass one
		     * in order to follow player.  (Non-harmful traps do not
		     * have ALLOW_TRAPS in info[].)  The dog only avoids the
		     * trap if you've seen it, unlike enemies who avoid traps
		     * if they've seen some trap of that type sometime in the
		     * past.  (Neither behavior is really realistic.)
		     */
		    struct trap *trap;

		    if ((info[i] & ALLOW_TRAPS) && (trap = t_at(level, nx, ny))) {
			if (mtmp->mleashed) {
			    if (flags.soundok) whimper(mtmp);
			} else
			    /* 1/40 chance of stepping on it anyway, in case
			     * it has to pass one to follow the player...
			     */
			    if (trap->tseen && rn2(40)) continue;
		    }
		}

		/* dog eschews cursed objects, but likes dog food */
		/* (minion isn't interested; `cursemsg' stays FALSE) */
		if (has_edog)
		for (obj = level->objects[nx][ny]; obj; obj = obj->nexthere) {
		    if (obj->cursed) cursemsg[i] = TRUE;
		    else if ((otyp = dogfood(mtmp, obj)) < MANFOOD &&
			     (otyp < ACCFOOD || edog->hungrytime <= moves)) {
			/* Note: our dog likes the food so much that he
			 * might eat it even when it conceals a cursed object */
			nix = nx;
			niy = ny;
			chi = i;
			do_eat = TRUE;
			cursemsg[i] = FALSE;	/* not reluctant */
			goto newdogpos;
		    }
		}
		/* didn't find something to eat; if we saw a cursed item and
		   aren't being forced to walk on it, usually keep looking */
		if (cursemsg[i] && !mtmp->mleashed && uncursedcnt > 0 &&
		    rn2(13 * uncursedcnt)) continue;

		/* lessen the chance of backtracking to previous position(s) */
		k = has_edog ? uncursedcnt : cnt;
		for (j = 0; j < MTSZ && j < k - 1; j++)
			if (nx == mtmp->mtrack[j].x && ny == mtmp->mtrack[j].y)
				if (rn2(MTSZ * (k - j))) goto nxti;

		j = ((ndist = GDIST(nx,ny)) - nidist) * appr;
		if ((j == 0 && !rn2(++chcnt)) || j < 0 ||
			(j > 0 && !whappr &&
				((omx == nix && omy == niy && !rn2(3))
					|| !rn2(12))
			)) {
			nix = nx;
			niy = ny;
			nidist = ndist;
			if (j < 0) chcnt = 0;
			chi = i;
		}
	nxti:	;
	}
newdogpos:
	if (nix != omx || niy != omy) {
		struct obj *mw_tmp;

		if (info[chi] & ALLOW_U) {
			if (mtmp->mleashed) { /* play it safe */
				pline("%s breaks loose of %s leash!",
				      Monnam(mtmp), mhis(level, mtmp));
				m_unleash(mtmp, FALSE);
			}
			mattacku(mtmp);
			return 0;
		}
		if (!m_in_out_region(mtmp, nix, niy))
		    return 1;
		if (((IS_ROCK(level->locations[nix][niy].typ) && may_dig(level, nix,niy)) ||
		     closed_door(level, nix, niy)) &&
		    mtmp->weapon_check != NO_WEAPON_WANTED &&
		    tunnels(mtmp->data) && needspick(mtmp->data)) {
		    if (closed_door(level, nix, niy)) {
			if (!(mw_tmp = MON_WEP(mtmp)) ||
			    !is_pick(mw_tmp) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_PICK_OR_AXE;
		    } else if (IS_TREE(level, level->locations[nix][niy].typ)) {
			if (!(mw_tmp = MON_WEP(mtmp)) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_AXE;
		    } else if (!(mw_tmp = MON_WEP(mtmp)) || !is_pick(mw_tmp)) {
			mtmp->weapon_check = NEED_PICK_AXE;
		    }
		    if (mtmp->weapon_check >= NEED_PICK_AXE &&
			mon_wield_item(mtmp))
			return 0;
		}
		/* insert a worm_move() if worms ever begin to eat things */
		remove_monster(level, omx, omy);
		place_monster(mtmp, nix, niy);
		if (cursemsg[chi] && (cansee(omx,omy) || cansee(nix,niy)))
			pline("%s moves only reluctantly.", Monnam(mtmp));
		for (j=MTSZ-1; j>0; j--) mtmp->mtrack[j] = mtmp->mtrack[j-1];
		mtmp->mtrack[0].x = omx;
		mtmp->mtrack[0].y = omy;
		/* We have to know if the pet's gonna do a combined eat and
		 * move before moving it, but it can't eat until after being
		 * moved.  Thus the do_eat flag.
		 */
		if (do_eat) {
		    if (dog_eat(mtmp, obj, omx, omy, FALSE) == 2) return 2;
		}
	} else if (mtmp->mleashed && distu(omx, omy) > 4) {
		/* an incredible kludge, but the only way to keep pooch near
		 * after it spends time eating or in a trap, etc.
		 */
		coord cc;

		nx = sgn(omx - u.ux);
		ny = sgn(omy - u.uy);
		cc.x = u.ux + nx;
		cc.y = u.uy + ny;
		if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;

		i  = xytod(nx, ny);
		for (j = (i + 7)%8; j < (i + 1)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		for (j = (i + 6)%8; j < (i + 2)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		cc.x = mtmp->mx;
		cc.y = mtmp->my;
dognext:
		if (!m_in_out_region(mtmp, nix, niy))
		  return 1;
		remove_monster(level, mtmp->mx, mtmp->my);
		place_monster(mtmp, cc.x, cc.y);
		newsym(cc.x,cc.y);
		set_apparxy(level, mtmp);
	}
	return 1;
}